

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall
TPZVec<TPZManVector<TFad<6,_double>,_3>_>::Resize
          (TPZVec<TPZManVector<TFad<6,_double>,_3>_> *this,int64_t newsize,
          TPZManVector<TFad<6,_double>,_3> *object)

{
  TFad<6,_double> *pTVar1;
  undefined1 auVar2 [16];
  ostream *this_00;
  ulong uVar3;
  ulong *size;
  TFad<6,_double> *pTVar4;
  TPZManVector<TFad<6,_double>,_3> *pTVar5;
  ulong in_RSI;
  TPZManVector<TFad<6,_double>,_3> *in_RDI;
  ulong uVar6;
  TPZManVector<TFad<6,_double>,_3> *unaff_retaddr;
  int64_t i;
  int64_t large;
  TPZManVector<TFad<6,_double>,_3> *newstore;
  TPZManVector<TFad<6,_double>,_3> *pTVar7;
  ulong local_98;
  TPZManVector<TFad<6,_double>,_3> *local_70;
  long local_40;
  TPZManVector<TFad<6,_double>,_3> *local_20;
  
  if ((long)in_RSI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  else if (in_RSI != (in_RDI->super_TPZVec<TFad<6,_double>_>).fNElements) {
    pTVar7 = in_RDI;
    if (in_RSI == 0) {
      local_20 = (TPZManVector<TFad<6,_double>,_3> *)0x0;
    }
    else {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = in_RSI;
      uVar3 = SUB168(auVar2 * ZEXT816(0xe0),0);
      uVar6 = uVar3 + 8;
      if (SUB168(auVar2 * ZEXT816(0xe0),8) != 0 || 0xfffffffffffffff7 < uVar3) {
        uVar6 = 0xffffffffffffffff;
      }
      size = (ulong *)operator_new__(uVar6);
      *size = in_RSI;
      local_70 = (TPZManVector<TFad<6,_double>,_3> *)(size + 1);
      local_20 = local_70;
      if (in_RSI != 0) {
        pTVar5 = local_70 + in_RSI;
        do {
          TPZManVector<TFad<6,_double>,_3>::TPZManVector(local_20,(int64_t)size);
          local_70 = local_70 + 1;
        } while (local_70 != pTVar5);
      }
    }
    local_98 = in_RSI;
    if ((in_RDI->super_TPZVec<TFad<6,_double>_>).fNElements < (long)in_RSI) {
      local_98 = (in_RDI->super_TPZVec<TFad<6,_double>_>).fNElements;
    }
    for (local_40 = 0; local_40 < (long)local_98; local_40 = local_40 + 1) {
      TPZManVector<TFad<6,_double>,_3>::operator=(unaff_retaddr,pTVar7);
    }
    for (; local_40 < (long)in_RSI; local_40 = local_40 + 1) {
      TPZManVector<TFad<6,_double>,_3>::operator=(unaff_retaddr,pTVar7);
    }
    if ((in_RDI->super_TPZVec<TFad<6,_double>_>).fStore != (TFad<6,_double> *)0x0) {
      pTVar1 = (in_RDI->super_TPZVec<TFad<6,_double>_>).fStore;
      if (pTVar1 != (TFad<6,_double> *)0x0) {
        pTVar7 = (TPZManVector<TFad<6,_double>,_3> *)pTVar1[-1].dx_[5];
        for (pTVar4 = (TFad<6,_double> *)((long)pTVar1 + (long)pTVar7 * 0xe0); pTVar1 != pTVar4;
            pTVar4 = (TFad<6,_double> *)(pTVar4[-4].dx_ + 2)) {
          TPZManVector<TFad<6,_double>,_3>::~TPZManVector(pTVar7);
        }
        operator_delete__(pTVar1[-1].dx_ + 5,(long)pTVar7 * 0xe0 + 8);
      }
      (in_RDI->super_TPZVec<TFad<6,_double>_>).fStore = (TFad<6,_double> *)0x0;
    }
    (in_RDI->super_TPZVec<TFad<6,_double>_>).fStore = (TFad<6,_double> *)local_20;
    (in_RDI->super_TPZVec<TFad<6,_double>_>).fNElements = in_RSI;
    (in_RDI->super_TPZVec<TFad<6,_double>_>).fNAlloc = in_RSI;
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}